

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O0

ssize_t __thiscall
merlin::graphical_model::read(graphical_model *this,int __fd,void *__buf,size_t __nbytes)

{
  allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_> *this_00;
  pointer pfVar1;
  istream *this_01;
  int iVar2;
  runtime_error *this_02;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  size_t sVar6;
  reference pvVar7;
  reference this_03;
  size_t sVar8;
  value *pvVar9;
  ssize_t sVar10;
  undefined4 in_register_00000034;
  size_t k;
  size_t j_1;
  convert_index ci;
  size_type local_158;
  size_t i_2;
  undefined1 local_148 [8];
  vector<merlin::factor,_std::allocator<merlin::factor>_> factors;
  double fval;
  variable V;
  size_t j;
  size_t i_1;
  undefined1 local_100 [8];
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> sets;
  undefined1 local_e0 [8];
  vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
  cliques;
  size_t i;
  undefined1 local_b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> dims;
  string local_98 [8];
  string err_msg;
  string local_68 [8];
  string st;
  size_t local_48;
  size_t nval;
  size_t v;
  size_t csize;
  size_t ncliques;
  size_t nvar;
  istream *piStack_18;
  bool positive_mode_local;
  istream *is_local;
  graphical_model *this_local;
  
  piStack_18 = (istream *)CONCAT44(in_register_00000034,__fd);
  nvar._7_1_ = (byte)__buf & 1;
  is_local = (istream *)this;
  std::__cxx11::string::string(local_68);
  std::operator>>(piStack_18,local_68);
  iVar2 = std::__cxx11::string::compare((char *)local_68);
  if (iVar2 == 0) {
    this->m_markov = true;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_68);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_98,"Merlin only supports the UAI Markov or Bayes file format.",
                 (allocator *)
                 ((long)&dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,local_98);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->m_markov = false;
  }
  std::istream::operator>>(piStack_18,&ncliques);
  sVar8 = ncliques;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,sVar8,
             (allocator<unsigned_long> *)((long)&i + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i + 7));
  for (cliques.
       super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0; this_01 = piStack_18,
      cliques.
      super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage < ncliques;
      cliques.
      super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&((cliques.
                              super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>)
                            ._M_impl.super__Vector_impl_data._M_start + 1)) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,
                        (size_type)
                        cliques.
                        super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::istream::operator>>(this_01,pvVar3);
  }
  std::istream::operator>>(piStack_18,&csize);
  sVar8 = csize;
  this_00 = (allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_> *)
            ((long)&sets.
                    super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>::allocator
            (this_00);
  std::
  vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
  ::vector((vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
            *)local_e0,sVar8,this_00);
  std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>::~allocator
            ((allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_> *)
             ((long)&sets.
                     super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar8 = csize;
  std::allocator<merlin::variable_set>::allocator
            ((allocator<merlin::variable_set> *)((long)&i_1 + 7));
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::vector
            ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)local_100,sVar8,
             (allocator<merlin::variable_set> *)((long)&i_1 + 7));
  std::allocator<merlin::variable_set>::~allocator
            ((allocator<merlin::variable_set> *)((long)&i_1 + 7));
  for (j = 0; sVar8 = csize, j < csize; j = j + 1) {
    std::istream::operator>>(piStack_18,&v);
    pvVar4 = std::
             vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
             ::operator[]((vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                           *)local_e0,j);
    std::vector<merlin::variable,_std::allocator<merlin::variable>_>::reserve(pvVar4,v);
    for (V.m_states = 0; V.m_states < v; V.m_states = V.m_states + 1) {
      std::istream::operator>>(piStack_18,&nval);
      sVar8 = nval;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,nval);
      variable::variable((variable *)&fval,sVar8,*pvVar3);
      pvVar4 = std::
               vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
               ::operator[]((vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                             *)local_e0,j);
      std::vector<merlin::variable,_std::allocator<merlin::variable>_>::push_back
                (pvVar4,(value_type *)&fval);
      pvVar5 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::operator[]
                         ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
                          local_100,j);
      variable_set::operator|=(pvVar5,(variable *)&fval);
    }
  }
  std::allocator<merlin::factor>::allocator((allocator<merlin::factor> *)((long)&i_2 + 7));
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
            ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_148,sVar8,
             (allocator<merlin::factor> *)((long)&i_2 + 7));
  std::allocator<merlin::factor>::~allocator((allocator<merlin::factor> *)((long)&i_2 + 7));
  local_158 = 0;
  while( true ) {
    if (csize <= local_158) {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator=
                (&this->m_factors,
                 (vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_148);
      fixup(this);
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector
                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_148);
      std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector
                ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)local_100);
      std::
      vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
      ::~vector((vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                 *)local_e0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
      sVar10 = std::__cxx11::string::~string(local_68);
      return sVar10;
    }
    std::istream::operator>>(piStack_18,&local_48);
    sVar8 = local_48;
    pvVar5 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::operator[]
                       ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
                        local_100,local_158);
    sVar6 = variable_set::num_states(pvVar5);
    if (sVar8 != sVar6) break;
    pvVar5 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::operator[]
                       ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
                        local_100,local_158);
    factor::factor((factor *)
                   &ci.m_target_order.
                    super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pvVar5,0.0);
    pvVar7 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                       ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_148,
                        local_158);
    factor::operator=(pvVar7,(factor *)
                             &ci.m_target_order.
                              super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    factor::~factor((factor *)
                    &ci.m_target_order.
                     super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
    if ((this->m_markov & 1U) == 0) {
      pvVar7 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                         ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_148,
                          local_158);
      pvVar4 = std::
               vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
               ::operator[]((vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                             *)local_e0,local_158);
      this_03 = std::vector<merlin::variable,_std::allocator<merlin::variable>_>::back(pvVar4);
      sVar8 = variable::label(this_03);
      factor::set_child(pvVar7,(int)sVar8);
    }
    pvVar4 = std::
             vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
             ::operator[]((vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                           *)local_e0,local_158);
    convert_index::convert_index((convert_index *)&j_1,pvVar4,false,true);
    for (k = 0; k < local_48; k = k + 1) {
      sVar8 = convert_index::convert((convert_index *)&j_1,k);
      std::istream::operator>>
                (piStack_18,
                 (double *)
                 &factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((nvar._7_1_ & 1) != 0) {
        if (((double)factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage != 0.0) ||
           (NAN((double)factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage))) {
          if (((double)factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage == 1.0) &&
             (!NAN((double)factors.
                           super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage))) {
            factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((double)factors.
                                   super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - 1e-06);
          }
        }
        else {
          factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((double)factors.
                                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1e-06);
        }
      }
      pfVar1 = factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pvVar7 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                         ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_148,
                          local_158);
      pvVar9 = factor::operator[](pvVar7,sVar8);
      *pvVar9 = (value)pfVar1;
    }
    convert_index::~convert_index((convert_index *)&j_1);
    local_158 = local_158 + 1;
  }
  __assert_fail("nval == sets[i].num_states()",
                "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/graphical_model.h"
                ,0xb1,"void merlin::graphical_model::read(std::istream &, bool)");
}

Assistant:

void read(std::istream& is, bool positive_mode = false) {

		// Read the header
		size_t nvar, ncliques, csize, v, nval;
		std::string st;
		is >> st;
		if ( st.compare("MARKOV") == 0 ) {
			m_markov = true;
		} else if ( st.compare("BAYES") == 0 ) {
			m_markov = false;
		} else {
			std::string err_msg("Merlin only supports the UAI Markov or Bayes file format.");
			throw std::runtime_error(err_msg);
		}

		// Read the number of variables and their domains
		is >> nvar;
		std::vector<size_t> dims(nvar);
		for (size_t i = 0; i < nvar; i++)
			is >> dims[i];

		// Read the number of factors and their scopes (scope is a variable_set)
		is >> ncliques;
		std::vector<std::vector<variable> > cliques(ncliques);
		std::vector<variable_set> sets(ncliques);
		for (size_t i = 0; i < ncliques; i++) {
			is >> csize;
			cliques[i].reserve(csize);
			for (size_t j = 0; j < csize; j++) {
				is >> v;
				variable V(v, dims[v]);
				cliques[i].push_back(V);
				sets[i] |= V;
			}
		}

		// Read the factor tables (ensure conversion to ordered scopes)
		double fval;
		std::vector<factor> factors(ncliques);
		for (size_t i = 0; i < ncliques; i++) {
			is >> nval;
			assert(nval == sets[i].num_states());
			factors[i] = factor(sets[i], 0.0); // preallocate memory
			if (m_markov == false) { // for Bayes nets, last variable is the child
				factors[i].set_child(cliques[i].back().label());
			}
			convert_index ci(cliques[i], false, true); // convert from source order (littleEndian) to target order (bigEndian)
			for (size_t j = 0; j < nval; j++) {
				size_t k = ci.convert(j);	// get the index in the factor table
				is >> fval; // read the factor value;
				if (positive_mode) { // force positive values (> 0) if enabled
					if (fval == 0.0) {
						fval += MERLIN_EPSILON; // adjust slightly for numerical stability
					} else if (fval == 1.0) {
						fval -= MERLIN_EPSILON; // adjust slightly for numerical stability
					}
				}

				factors[i][k] = fval; // save the factor value into the table
			}
		}

		m_factors = factors;
		fixup();
	}